

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *
testing::internal::
MatcherCastImpl<const_std::pair<int,_phmap::priv::NonStandardLayout>_&,_std::pair<const_int,_phmap::priv::NonStandardLayout>_>
::Cast(Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *__return_storage_ptr__,
      pair<const_int,_phmap::priv::NonStandardLayout> *polymorphic_matcher_or_value)

{
  pair<const_int,_phmap::priv::NonStandardLayout> *polymorphic_matcher_or_value_local;
  
  CastImpl(__return_storage_ptr__,polymorphic_matcher_or_value);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> Cast(const M& polymorphic_matcher_or_value) {
    // M can be a polymorphic matcher, in which case we want to use
    // its conversion operator to create Matcher<T>.  Or it can be a value
    // that should be passed to the Matcher<T>'s constructor.
    //
    // We can't call Matcher<T>(polymorphic_matcher_or_value) when M is a
    // polymorphic matcher because it'll be ambiguous if T has an implicit
    // constructor from M (this usually happens when T has an implicit
    // constructor from any type).
    //
    // It won't work to unconditionally implicit_cast
    // polymorphic_matcher_or_value to Matcher<T> because it won't trigger
    // a user-defined conversion from M to T if one exists (assuming M is
    // a value).
    return CastImpl(polymorphic_matcher_or_value,
                    std::is_convertible<M, Matcher<T>>{},
                    std::is_convertible<M, T>{});
  }